

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_sl.c
# Opt level: O2

uint64_t sylvan_skiplist_get(sylvan_skiplist_t l,MTBDD dd)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar5;
  ulong uVar4;
  
  if ((dd & 0x7fffffffffffffff) == 0) {
LAB_0010fe57:
    uVar4 = 0;
  }
  else {
    uVar5 = 0xd;
    uVar4 = 0;
LAB_0010fe26:
    uVar3 = uVar4;
    uVar2 = l->buckets[uVar3].next[uVar5].super___atomic_base<unsigned_int>._M_i & 0x7fffffff;
    uVar4 = (ulong)uVar2;
    if (uVar2 == 0) goto LAB_0010fe4e;
    uVar1 = l->buckets[uVar4].dd;
    if (uVar1 != dd) goto code_r0x0010fe4c;
  }
  return uVar4;
code_r0x0010fe4c:
  if (dd <= uVar1) {
LAB_0010fe4e:
    if (uVar5 == 0) goto LAB_0010fe57;
    uVar5 = (ulong)((int)uVar5 - 1);
    uVar4 = uVar3;
  }
  goto LAB_0010fe26;
}

Assistant:

uint64_t
sylvan_skiplist_get(sylvan_skiplist_t l, MTBDD dd)
{
    if (dd == mtbdd_false || dd == mtbdd_true) return 0;

    uint32_t loc = 0, k = SL_DEPTH-1;
    for (;;) {
        /* invariant: [loc].dd < dd */
        /* note: this is always true for loc==0 */
        sl_bucket *e = l->buckets + loc;
        uint32_t loc_next = atomic_load_explicit(e->next+k, memory_order_acquire) & 0x7fffffff;
        if (loc_next != 0 && l->buckets[loc_next].dd == dd) {
            /* found */
            return loc_next;
        } else if (loc_next != 0 && l->buckets[loc_next].dd < dd) {
            /* go right */
            loc = loc_next;
        } else if (k > 0) {
            /* go down */
            k--;
        } else {
            return 0;
        }
    }
}